

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__horizontal_gather_2_channels_with_n_coeffs_mod1
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  pfVar1 = output_buffer + output_sub_size * 2;
  pfVar3 = horizontal_coefficients + 4;
  do {
    lVar4 = (long)(horizontal_contributors->n0 * 2);
    pfVar5 = decode_buffer + lVar4;
    fVar11 = *pfVar5 * *horizontal_coefficients;
    fVar12 = pfVar5[1] * *horizontal_coefficients;
    fVar13 = pfVar5[2] * horizontal_coefficients[1];
    fVar14 = pfVar5[3] * horizontal_coefficients[1];
    fVar7 = horizontal_coefficients[2] * pfVar5[4];
    fVar8 = horizontal_coefficients[2] * pfVar5[5];
    fVar9 = horizontal_coefficients[3] * pfVar5[6];
    fVar10 = horizontal_coefficients[3] * pfVar5[7];
    pfVar5 = decode_buffer + lVar4 + 8;
    iVar2 = (~horizontal_contributors->n0 + horizontal_contributors->n1 >> 2) + 1;
    pfVar6 = pfVar3;
    do {
      fVar11 = fVar11 + *pfVar5 * *pfVar6;
      fVar12 = fVar12 + pfVar5[1] * *pfVar6;
      fVar13 = fVar13 + pfVar5[2] * pfVar6[1];
      fVar14 = fVar14 + pfVar5[3] * pfVar6[1];
      fVar7 = fVar7 + pfVar6[2] * pfVar5[4];
      fVar8 = fVar8 + pfVar6[2] * pfVar5[5];
      fVar9 = fVar9 + pfVar6[3] * pfVar5[6];
      fVar10 = fVar10 + pfVar6[3] * pfVar5[7];
      pfVar5 = pfVar5 + 8;
      iVar2 = iVar2 + -1;
      pfVar6 = pfVar6 + 4;
    } while (1 < iVar2);
    *(ulong *)output_buffer =
         CONCAT44(fVar10 + fVar14 + 0.0 +
                  fVar8 + fVar12 + (float)((ulong)*(undefined8 *)pfVar5 >> 0x20) * *pfVar6,
                  fVar9 + fVar13 + 0.0 + fVar7 + fVar11 + (float)*(undefined8 *)pfVar5 * *pfVar6);
    horizontal_coefficients = horizontal_coefficients + coefficient_width;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 2;
    pfVar3 = pfVar3 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_n_coeffs_mod1 )( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    int n = ( ( horizontal_contributors->n1 - horizontal_contributors->n0 + 1 ) - 5 + 3 ) >> 2;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    STBIR_SIMD_NO_UNROLL_LOOP_START
    do {
      hc += 4;
      decode += STBIR__horizontal_channels * 4;
      stbir__4_coeff_continue_from_4( 0 );
      --n;
    } while ( n > 0 );
    stbir__1_coeff_remnant( 4 );
    stbir__store_output();
  } while ( output < output_end );
}